

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidgetPrivate * __thiscall
QWidgetPrivate::naturalWidgetFont(QWidgetPrivate *this,uint inheritedMask)

{
  undefined4 uVar1;
  QWidget *widget;
  long lVar2;
  undefined8 uVar3;
  byte bVar4;
  char cVar5;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar6;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  lVar6 = CONCAT44(in_register_00000034,inheritedMask);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)(lVar6 + 8);
  bVar4 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::font((QApplication *)this,widget);
  lVar2 = *(long *)&widget->field_0x8;
  if (((bVar4 == 0) && ((*(uint *)(lVar2 + 0x248) & 2) != 0)) ||
     (((((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0 && ((*(byte *)(lVar2 + 0x246) & 1) == 0))
      && ((*(long *)(lVar6 + 0x78) == 0 || (*(long *)(*(long *)(lVar6 + 0x78) + 0x10) == 0))))))
  goto LAB_00300e41;
  lVar2 = *(long *)(lVar2 + 0x10);
  if (lVar2 == 0) {
    if ((*(long *)(lVar6 + 0x78) == 0) ||
       (in_EDX == 0 || *(long *)(*(long *)(lVar6 + 0x78) + 0x10) == 0)) goto LAB_00300e41;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsWidget::font((QGraphicsWidget *)&local_48);
  }
  else {
    if ((byte)(~bVar4 & (*(byte *)(*(long *)(lVar2 + 8) + 0x248) & 2) >> 1) != 0) goto LAB_00300e41;
    QApplication::font();
    cVar5 = QFont::isCopyOf((QFont *)this);
    QFont::~QFont((QFont *)&local_48);
    if (cVar5 != '\0') {
      QFont::operator=((QFont *)this,(QFont *)(*(long *)(lVar2 + 0x20) + 0x38));
      goto LAB_00300e41;
    }
    if (in_EDX == 0) goto LAB_00300e41;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_48,(QFont *)(*(long *)(lVar2 + 0x20) + 0x38));
  }
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,in_EDX);
  QFont::resolve((QFont *)&local_58);
  uVar3 = *(undefined8 *)this;
  *(undefined8 *)this = local_58;
  uVar1 = *(undefined4 *)&this->field_0x8;
  *(undefined4 *)&this->field_0x8 = local_50;
  local_58 = uVar3;
  local_50 = uVar1;
  QFont::~QFont((QFont *)&local_58);
  QFont::~QFont((QFont *)&local_48);
LAB_00300e41:
  *(undefined4 *)&this->field_0x8 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QWidgetPrivate::naturalWidgetFont(uint inheritedMask) const
{
    Q_Q(const QWidget);

    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    QFont naturalFont = QApplication::font(q);
    if ((!q->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles)
        && (!q->isWindow() || q->testAttribute(Qt::WA_WindowPropagation)
#if QT_CONFIG(graphicsview)
            || (extra && extra->proxyWidget)
#endif // QT_CONFIG(graphicsview)
            )) {
        if (QWidget *p = q->parentWidget()) {
            if (!p->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles) {
                if (!naturalFont.isCopyOf(QApplication::font())) {
                    if (inheritedMask != 0) {
                        QFont inheritedFont = p->font();
                        inheritedFont.setResolveMask(inheritedMask);
                        naturalFont = inheritedFont.resolve(naturalFont);
                    } // else nothing to do (naturalFont = naturalFont)
                } else {
                    naturalFont = p->font();
                }
            }
        }
#if QT_CONFIG(graphicsview)
        else if (extra && extra->proxyWidget) {
            if (inheritedMask != 0) {
                QFont inheritedFont = extra->proxyWidget->font();
                inheritedFont.setResolveMask(inheritedMask);
                naturalFont = inheritedFont.resolve(naturalFont);
            } // else nothing to do (naturalFont = naturalFont)
        }
#endif // QT_CONFIG(graphicsview)
    }
    naturalFont.setResolveMask(0);
    return naturalFont;
}